

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SampledFunc::SampledFunc(SampledFunc *this)

{
  allocator<char> local_31;
  string local_30;
  SampledFunc *local_10;
  SampledFunc *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$sampled",&local_31);
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Function);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine = (_func_int **)&PTR__SampledFunc_00916968;
  return;
}

Assistant:

SampledFunc() : SystemSubroutine("$sampled", SubroutineKind::Function) {}